

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O1

int __thiscall CSnapshot::Crc(CSnapshot *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  CSnapshot *pCVar6;
  
  uVar2 = (ulong)this->m_NumItems;
  if (0 < (long)uVar2) {
    uVar4 = 0;
    iVar1 = 0;
    do {
      pCVar6 = (CSnapshot *)(&this[1].m_NumItems + uVar2 + uVar4);
      if (uVar4 == this->m_NumItems - 1) {
        pCVar6 = this;
      }
      uVar5 = (pCVar6->m_DataSize - (&this[1].m_DataSize)[uVar2 + uVar4]) - 4;
      if (3 < (int)uVar5) {
        uVar3 = 0;
        do {
          iVar1 = iVar1 + *(int *)((long)&(this + 1)[uVar2].m_NumItems +
                                  uVar3 * 4 + (long)(&this[1].m_DataSize)[uVar2 + uVar4]);
          uVar3 = uVar3 + 1;
        } while (uVar5 >> 2 != uVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int CSnapshot::Crc() const
{
	int Crc = 0;

	for(int i = 0; i < m_NumItems; i++)
	{
		const CSnapshotItem *pItem = GetItem(i);
		int Size = GetItemSize(i);

		for(int b = 0; b < Size/4; b++)
			Crc += pItem->Data()[b];
	}
	return Crc;
}